

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aead_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_18ac8a::PerAEADTest_TruncatedTags_Test::TestBody
          (PerAEADTest_TruncatedTags_Test *this)

{
  int iVar1;
  ParamType *pPVar2;
  EVP_AEAD *pEVar3;
  size_t sVar4;
  uint uVar5;
  ulong tag_len;
  evp_aead_ctx_st_state *this_00;
  EVP_AEAD_CTX *ctx_00;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  AssertionResult *this_02;
  long *plVar6;
  char *pcVar7;
  size_t sVar8;
  uint8_t kSentinel;
  uint8_t plaintext [1];
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_;
  uint8_t plaintext2 [17];
  undefined1 local_3c8 [16];
  AssertHelper local_3b8;
  size_t ciphertext_len;
  size_t plaintext2_len;
  size_t nonce_len;
  uint8_t nonce [32];
  size_t overhead_used;
  size_t key_len;
  uint8_t ciphertext [128];
  size_t expected_overhead;
  uint8_t key [80];
  ScopedEVP_AEAD_CTX ctx;
  
  pPVar2 = testing::WithParamInterface<(anonymous_namespace)::KnownAEAD>::GetParam();
  if ((pPVar2->flags & 2) == 0) {
    return;
  }
  key[0x40] = '\0';
  key[0x41] = '\0';
  key[0x42] = '\0';
  key[0x43] = '\0';
  key[0x44] = '\0';
  key[0x45] = '\0';
  key[0x46] = '\0';
  key[0x47] = '\0';
  key[0x48] = '\0';
  key[0x49] = '\0';
  key[0x4a] = '\0';
  key[0x4b] = '\0';
  key[0x4c] = '\0';
  key[0x4d] = '\0';
  key[0x4e] = '\0';
  key[0x4f] = '\0';
  key[0x30] = '\0';
  key[0x31] = '\0';
  key[0x32] = '\0';
  key[0x33] = '\0';
  key[0x34] = '\0';
  key[0x35] = '\0';
  key[0x36] = '\0';
  key[0x37] = '\0';
  key[0x38] = '\0';
  key[0x39] = '\0';
  key[0x3a] = '\0';
  key[0x3b] = '\0';
  key[0x3c] = '\0';
  key[0x3d] = '\0';
  key[0x3e] = '\0';
  key[0x3f] = '\0';
  key[0x20] = '\0';
  key[0x21] = '\0';
  key[0x22] = '\0';
  key[0x23] = '\0';
  key[0x24] = '\0';
  key[0x25] = '\0';
  key[0x26] = '\0';
  key[0x27] = '\0';
  key[0x28] = '\0';
  key[0x29] = '\0';
  key[0x2a] = '\0';
  key[0x2b] = '\0';
  key[0x2c] = '\0';
  key[0x2d] = '\0';
  key[0x2e] = '\0';
  key[0x2f] = '\0';
  key[0x10] = '\0';
  key[0x11] = '\0';
  key[0x12] = '\0';
  key[0x13] = '\0';
  key[0x14] = '\0';
  key[0x15] = '\0';
  key[0x16] = '\0';
  key[0x17] = '\0';
  key[0x18] = '\0';
  key[0x19] = '\0';
  key[0x1a] = '\0';
  key[0x1b] = '\0';
  key[0x1c] = '\0';
  key[0x1d] = '\0';
  key[0x1e] = '\0';
  key[0x1f] = '\0';
  key[0] = '\0';
  key[1] = '\0';
  key[2] = '\0';
  key[3] = '\0';
  key[4] = '\0';
  key[5] = '\0';
  key[6] = '\0';
  key[7] = '\0';
  key[8] = '\0';
  key[9] = '\0';
  key[10] = '\0';
  key[0xb] = '\0';
  key[0xc] = '\0';
  key[0xd] = '\0';
  key[0xe] = '\0';
  key[0xf] = '\0';
  pEVar3 = PerAEADTest::aead(&this->super_PerAEADTest);
  key_len = EVP_AEAD_key_length(pEVar3);
  ciphertext[0] = 'P';
  ciphertext[1] = '\0';
  ciphertext[2] = '\0';
  ciphertext[3] = '\0';
  ciphertext[4] = '\0';
  ciphertext[5] = '\0';
  ciphertext[6] = '\0';
  ciphertext[7] = '\0';
  testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
            ((internal *)&ctx,"sizeof(key)","key_len",(unsigned_long *)ciphertext,&key_len);
  if ((char)ctx.ctx_.aead == '\0') {
    testing::Message::Message((Message *)ciphertext);
    if (ctx.ctx_.state.alignment == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)ctx.ctx_.state.alignment;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)nonce,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
               ,0x1e3,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)nonce,(Message *)ciphertext);
    this_02 = (AssertionResult *)nonce;
LAB_00209bdd:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    if (ciphertext._0_8_ != 0) {
      (**(code **)(*(long *)ciphertext._0_8_ + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&ctx.ctx_.state.alignment);
    return;
  }
  this_00 = &ctx.ctx_.state;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&this_00->alignment);
  nonce[0x10] = '\0';
  nonce[0x11] = '\0';
  nonce[0x12] = '\0';
  nonce[0x13] = '\0';
  nonce[0x14] = '\0';
  nonce[0x15] = '\0';
  nonce[0x16] = '\0';
  nonce[0x17] = '\0';
  nonce[0x18] = '\0';
  nonce[0x19] = '\0';
  nonce[0x1a] = '\0';
  nonce[0x1b] = '\0';
  nonce[0x1c] = '\0';
  nonce[0x1d] = '\0';
  nonce[0x1e] = '\0';
  nonce[0x1f] = '\0';
  nonce[0] = '\0';
  nonce[1] = '\0';
  nonce[2] = '\0';
  nonce[3] = '\0';
  nonce[4] = '\0';
  nonce[5] = '\0';
  nonce[6] = '\0';
  nonce[7] = '\0';
  nonce[8] = '\0';
  nonce[9] = '\0';
  nonce[10] = '\0';
  nonce[0xb] = '\0';
  nonce[0xc] = '\0';
  nonce[0xd] = '\0';
  nonce[0xe] = '\0';
  nonce[0xf] = '\0';
  pEVar3 = PerAEADTest::aead((PerAEADTest *)this_00);
  nonce_len = EVP_AEAD_nonce_length(pEVar3);
  ciphertext[0] = ' ';
  ciphertext[1] = '\0';
  ciphertext[2] = '\0';
  ciphertext[3] = '\0';
  ciphertext[4] = '\0';
  ciphertext[5] = '\0';
  ciphertext[6] = '\0';
  ciphertext[7] = '\0';
  testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
            ((internal *)&ctx,"sizeof(nonce)","nonce_len",(unsigned_long *)ciphertext,&nonce_len);
  if ((char)ctx.ctx_.aead == '\0') {
    testing::Message::Message((Message *)ciphertext);
    if (ctx.ctx_.state.alignment == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)ctx.ctx_.state.alignment;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
               ,0x1e8,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)ciphertext);
    this_02 = &gtest_ar_;
    goto LAB_00209bdd;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ctx.ctx_.state.alignment);
  pPVar2 = testing::WithParamInterface<(anonymous_namespace)::KnownAEAD>::GetParam();
  uVar5 = pPVar2->flags >> 8 & 0xf;
  tag_len = (ulong)(uVar5 + (uVar5 == 0));
  ctx_00 = &ctx.ctx_;
  EVP_AEAD_CTX_zero(ctx_00);
  pEVar3 = PerAEADTest::aead((PerAEADTest *)ctx_00);
  pcVar7 = (char *)0x0;
  iVar1 = EVP_AEAD_CTX_init(&ctx.ctx_,pEVar3,key,key_len,tag_len,(ENGINE *)0x0);
  this_01 = &gtest_ar_.message_;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = iVar1 != 0;
  if (iVar1 == 0) {
    testing::Message::Message((Message *)plaintext2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)ciphertext,(internal *)&gtest_ar_,
               (AssertionResult *)
               "EVP_AEAD_CTX_init(ctx.get(), aead(), key, key_len, tag_len, __null )","false","true"
               ,pcVar7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
               ,0x1ed,(char *)ciphertext._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)plaintext2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    std::__cxx11::string::~string((string *)ciphertext);
    plVar6 = (long *)plaintext2._0_8_;
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_01);
    plaintext[0] = 'A';
    kSentinel = '*';
    builtin_memcpy(ciphertext,
                   "********************************************************************************************************************************"
                   ,0x80);
    pcVar7 = (char *)nonce_len;
    iVar1 = EVP_AEAD_CTX_seal(&ctx.ctx_,ciphertext,&ciphertext_len,0x80,nonce,nonce_len,plaintext,1,
                              (uint8_t *)0x0,0);
    this_01 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(plaintext2 + 8);
    plaintext2[8] = '\0';
    plaintext2[9] = '\0';
    plaintext2[10] = '\0';
    plaintext2[0xb] = '\0';
    plaintext2[0xc] = '\0';
    plaintext2[0xd] = '\0';
    plaintext2[0xe] = '\0';
    plaintext2[0xf] = '\0';
    plaintext2[0] = iVar1 != 0;
    if (iVar1 != 0) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(this_01);
      for (sVar8 = ciphertext_len; sVar8 < 0x80; sVar8 = sVar8 + 1) {
        testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
                  ((internal *)&gtest_ar_,"kSentinel","ciphertext[i]",&kSentinel,ciphertext + sVar8)
        ;
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)plaintext2);
          std::operator<<((ostream *)(plaintext2._0_8_ + 0x10),
                          "Sealing wrote off the end of the buffer.");
          pcVar7 = "";
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar7 = *(char **)gtest_ar_.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                     ,0x1fc,pcVar7);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__2,(Message *)plaintext2);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
          if (plaintext2._0_8_ != 0) {
            (**(code **)(*(long *)plaintext2._0_8_ + 8))();
          }
        }
        this_01 = &gtest_ar_.message_;
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(this_01);
      }
      overhead_used = ciphertext_len - 1;
      pEVar3 = PerAEADTest::aead((PerAEADTest *)this_01);
      sVar8 = EVP_AEAD_max_overhead(pEVar3);
      pEVar3 = PerAEADTest::aead((PerAEADTest *)pEVar3);
      sVar4 = EVP_AEAD_max_tag_len(pEVar3);
      expected_overhead = (sVar8 + tag_len) - sVar4;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&gtest_ar_,"overhead_used","expected_overhead",&overhead_used,
                 &expected_overhead);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)plaintext2);
        std::operator<<((ostream *)(plaintext2._0_8_ + 0x10),
                        "AEAD is probably ignoring request to truncate tags.");
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                   ,0x203,pcVar7);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar__2,(Message *)plaintext2);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
        if (plaintext2._0_8_ != 0) {
          (**(code **)(*(long *)plaintext2._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      builtin_memcpy(plaintext2,"*****************",0x11);
      pcVar7 = (char *)nonce_len;
      iVar1 = EVP_AEAD_CTX_open(&ctx.ctx_,plaintext2,&plaintext2_len,0x11,nonce,nonce_len,ciphertext
                                ,ciphertext_len,(uint8_t *)0x0,0);
      this_01 = &gtest_ar__2.message_;
      gtest_ar__2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__2.success_ = iVar1 != 0;
      if (iVar1 == 0) {
        testing::Message::Message((Message *)local_3c8);
        std::operator<<((ostream *)(local_3c8._0_8_ + 0x10),
                        "Opening with truncated tag didn\'t work.");
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_,(internal *)&gtest_ar__2,
                   (AssertionResult *)
                   "EVP_AEAD_CTX_open( ctx.get(), plaintext2, &plaintext2_len, sizeof(plaintext2), nonce, nonce_len, ciphertext, ciphertext_len, nullptr , 0)"
                   ,"false","true",pcVar7);
        testing::internal::AssertHelper::AssertHelper
                  (&local_3b8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                   ,0x20c,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
        testing::internal::AssertHelper::operator=(&local_3b8,(Message *)local_3c8);
        testing::internal::AssertHelper::~AssertHelper(&local_3b8);
        std::__cxx11::string::~string((string *)&gtest_ar_);
        if ((AssertHelperData *)local_3c8._0_8_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_3c8._0_8_ + 8))();
        }
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(this_01);
        for (sVar8 = plaintext2_len; sVar8 < 0x11; sVar8 = sVar8 + 1) {
          testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
                    ((internal *)&gtest_ar_,"kSentinel","plaintext2[i]",&kSentinel,
                     plaintext2 + sVar8);
          if (gtest_ar_.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar__2);
            std::operator<<((ostream *)(gtest_ar__2._0_8_ + 0x10),
                            "Opening wrote off the end of the buffer.");
            pcVar7 = "";
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl !=
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar7 = *(char **)gtest_ar_.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_3c8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                       ,0x211,pcVar7);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_3c8,(Message *)&gtest_ar__2);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3c8);
            if (gtest_ar__2._0_8_ != 0) {
              (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
        }
        gtest_ar__2._0_8_ = plaintext;
        gtest_ar__2.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x1;
        local_3c8._0_8_ = plaintext2;
        local_3c8._8_8_ = plaintext2_len;
        testing::internal::CmpHelperEQ<Bytes,Bytes>
                  ((internal *)&gtest_ar_,"Bytes(plaintext)","Bytes(plaintext2, plaintext2_len)",
                   (Bytes *)&gtest_ar__2,(Bytes *)local_3c8);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar__2);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = *(char **)gtest_ar_.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_3c8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                     ,0x215,pcVar7);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)local_3c8,(Message *)&gtest_ar__2);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3c8);
          if (gtest_ar__2._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
          }
        }
        this_01 = &gtest_ar_.message_;
      }
      goto LAB_0020a020;
    }
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)plaintext2,
               (AssertionResult *)
               "EVP_AEAD_CTX_seal(ctx.get(), ciphertext, &ciphertext_len, sizeof(ciphertext), nonce, nonce_len, plaintext, sizeof(plaintext), nullptr , 0)"
               ,"false","true",pcVar7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3c8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
               ,0x1f8,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3c8,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3c8);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    plVar6 = (long *)gtest_ar__2._0_8_;
  }
  if (plVar6 != (long *)0x0) {
    (**(code **)(*plVar6 + 8))();
  }
LAB_0020a020:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_01);
  bssl::internal::StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>::
  ~StackAllocated(&ctx);
  return;
}

Assistant:

TEST_P(PerAEADTest, TruncatedTags) {
  if (!(GetParam().flags & kCanTruncateTags)) {
    return;
  }

  uint8_t key[EVP_AEAD_MAX_KEY_LENGTH];
  OPENSSL_memset(key, 0, sizeof(key));
  const size_t key_len = EVP_AEAD_key_length(aead());
  ASSERT_GE(sizeof(key), key_len);

  uint8_t nonce[EVP_AEAD_MAX_NONCE_LENGTH];
  OPENSSL_memset(nonce, 0, sizeof(nonce));
  const size_t nonce_len = EVP_AEAD_nonce_length(aead());
  ASSERT_GE(sizeof(nonce), nonce_len);

  const size_t tag_len = MinimumTagLength(GetParam().flags);
  bssl::ScopedEVP_AEAD_CTX ctx;
  ASSERT_TRUE(EVP_AEAD_CTX_init(ctx.get(), aead(), key, key_len, tag_len,
                                NULL /* ENGINE */));

  const uint8_t plaintext[1] = {'A'};

  uint8_t ciphertext[128];
  size_t ciphertext_len;
  constexpr uint8_t kSentinel = 42;
  OPENSSL_memset(ciphertext, kSentinel, sizeof(ciphertext));

  ASSERT_TRUE(EVP_AEAD_CTX_seal(ctx.get(), ciphertext, &ciphertext_len,
                                sizeof(ciphertext), nonce, nonce_len, plaintext,
                                sizeof(plaintext), nullptr /* ad */, 0));

  for (size_t i = ciphertext_len; i < sizeof(ciphertext); i++) {
    // Sealing must not write past where it said it did.
    EXPECT_EQ(kSentinel, ciphertext[i])
        << "Sealing wrote off the end of the buffer.";
  }

  const size_t overhead_used = ciphertext_len - sizeof(plaintext);
  const size_t expected_overhead =
      tag_len + EVP_AEAD_max_overhead(aead()) - EVP_AEAD_max_tag_len(aead());
  EXPECT_EQ(overhead_used, expected_overhead)
      << "AEAD is probably ignoring request to truncate tags.";

  uint8_t plaintext2[sizeof(plaintext) + 16];
  OPENSSL_memset(plaintext2, kSentinel, sizeof(plaintext2));

  size_t plaintext2_len;
  ASSERT_TRUE(EVP_AEAD_CTX_open(
      ctx.get(), plaintext2, &plaintext2_len, sizeof(plaintext2), nonce,
      nonce_len, ciphertext, ciphertext_len, nullptr /* ad */, 0))
      << "Opening with truncated tag didn't work.";

  for (size_t i = plaintext2_len; i < sizeof(plaintext2); i++) {
    // Likewise, opening should also stay within bounds.
    EXPECT_EQ(kSentinel, plaintext2[i])
        << "Opening wrote off the end of the buffer.";
  }

  EXPECT_EQ(Bytes(plaintext), Bytes(plaintext2, plaintext2_len));
}